

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments(texts *args)

{
  options __x;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  reference pbVar4;
  runtime_error *this;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  TVar5;
  text arg;
  text val;
  text opt;
  iterator pos;
  bool in_options;
  texts in;
  options option;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc78;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ppVar6;
  Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc80;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  byte bVar7;
  undefined4 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  undefined5 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc6;
  undefined1 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcc9;
  undefined1 in_stack_fffffffffffffcca;
  undefined1 in_stack_fffffffffffffccb;
  undefined1 in_stack_fffffffffffffccc;
  undefined1 in_stack_fffffffffffffccd;
  undefined1 in_stack_fffffffffffffcce;
  undefined1 in_stack_fffffffffffffccf;
  undefined1 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcd9;
  undefined1 in_stack_fffffffffffffcda;
  undefined1 in_stack_fffffffffffffcdb;
  undefined1 in_stack_fffffffffffffcdc;
  undefined1 in_stack_fffffffffffffcdd;
  undefined1 in_stack_fffffffffffffcde;
  undefined1 in_stack_fffffffffffffcdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  seed_t in_stack_fffffffffffffcf0;
  text *in_stack_fffffffffffffd68;
  text *in_stack_fffffffffffffd70;
  text *in_stack_fffffffffffffda0;
  text *in_stack_fffffffffffffda8;
  string local_248 [32];
  runtime_error local_228 [16];
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [8];
  text *in_stack_fffffffffffffe58;
  allocator local_189;
  string local_188 [32];
  string local_168 [36];
  undefined4 local_144;
  Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  string local_130 [96];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  byte local_41;
  options local_24;
  
  options::options(&local_24);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10789c);
  local_41 = 1;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc78);
  local_50._M_current = local_58;
  do {
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) {
      bVar7 = 1;
      if ((local_24.pass & 1U) == 0) {
        bVar7 = local_24.zen;
      }
      local_24.pass = (bool)(bVar7 & 1);
      ppVar6 = (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(CONCAT17(local_24.zen,
                            CONCAT16(bVar7,CONCAT15(local_24.time,
                                                    CONCAT14(local_24.tags,
                                                             CONCAT13(local_24.list,
                                                                      CONCAT12(local_24.count,
                                                                               CONCAT11(local_24.
                                                  abort,local_24.help))))))) & 0xff01ffffffffffff);
      this_00 = (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)CONCAT44(local_24.repeat,
                            CONCAT13(local_24.version,
                                     CONCAT12(local_24.verbose,
                                              CONCAT11(local_24.random,local_24.lexical))));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffce0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffcdf,
                           CONCAT16(in_stack_fffffffffffffcde,
                                    CONCAT15(in_stack_fffffffffffffcdd,
                                             CONCAT14(in_stack_fffffffffffffcdc,
                                                      CONCAT13(in_stack_fffffffffffffcdb,
                                                               CONCAT12(in_stack_fffffffffffffcda,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
      __x._8_8_ = in_stack_fffffffffffffce8;
      __x._0_8_ = in_stack_fffffffffffffce0;
      __x.seed = in_stack_fffffffffffffcf0;
      std::
      make_pair<lest::options,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__x,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffccf,
                                 CONCAT16(in_stack_fffffffffffffcce,
                                          CONCAT15(in_stack_fffffffffffffccd,
                                                   CONCAT14(in_stack_fffffffffffffccc,
                                                            CONCAT13(in_stack_fffffffffffffccb,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffffcca,
                                                  CONCAT11(in_stack_fffffffffffffcc9,
                                                           in_stack_fffffffffffffcc8))))))));
      std::
      pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(this_00,ppVar6);
      std::
      pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair((pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x1085b5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      local_144 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      return in_RDI;
    }
    std::__cxx11::string::string(local_90);
    std::__cxx11::string::string(local_b0);
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_50);
    std::__cxx11::string::string(local_d0,(string *)pbVar4);
    std::__cxx11::string::string(local_130,local_d0);
    split_option(in_stack_fffffffffffffe58);
    TVar5 = tie<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc80);
    in_stack_fffffffffffffce8 = TVar5.second;
    in_stack_fffffffffffffcf0 = (seed_t)TVar5.first;
    local_140 = TVar5;
    Tie<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    std::__cxx11::string::~string(local_130);
    if ((local_41 & 1) == 0) {
LAB_0010845b:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                  (value_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_144 = 0;
    }
    else {
      in_stack_fffffffffffffce0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::operator[]((ulong)local_90);
      if (*in_stack_fffffffffffffce0 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)0x2d) {
        local_41 = 0;
        goto LAB_0010845b;
      }
      in_stack_fffffffffffffcdf =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
      if ((bool)in_stack_fffffffffffffcdf) {
        local_41 = 0;
        local_144 = 4;
        goto LAB_0010847d;
      }
      in_stack_fffffffffffffcde =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
      if ((bool)in_stack_fffffffffffffcde) {
LAB_00107b95:
        local_24.help = true;
        local_144 = 4;
      }
      else {
        in_stack_fffffffffffffcdd =
             std::operator==((char *)in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->first);
        if ((bool)in_stack_fffffffffffffcdd) goto LAB_00107b95;
        in_stack_fffffffffffffcdc =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
        if ((bool)in_stack_fffffffffffffcdc) {
LAB_00107bf5:
          local_24.abort = true;
          local_144 = 4;
        }
        else {
          in_stack_fffffffffffffcdb =
               std::operator==((char *)in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->first);
          if ((bool)in_stack_fffffffffffffcdb) goto LAB_00107bf5;
          in_stack_fffffffffffffcda =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
          if ((bool)in_stack_fffffffffffffcda) {
LAB_00107c55:
            local_24.count = true;
            local_144 = 4;
          }
          else {
            in_stack_fffffffffffffcd9 =
                 std::operator==((char *)in_stack_fffffffffffffc80,&in_stack_fffffffffffffc78->first
                                );
            if ((bool)in_stack_fffffffffffffcd9) goto LAB_00107c55;
            in_stack_fffffffffffffcd8 =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78);
            if ((bool)in_stack_fffffffffffffcd8) {
LAB_00107cb5:
              local_24.tags = true;
              local_144 = 4;
            }
            else {
              bVar1 = std::operator==((char *)in_stack_fffffffffffffc80,
                                      &in_stack_fffffffffffffc78->first);
              if (bVar1) goto LAB_00107cb5;
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78
                                     );
              if (bVar1) {
LAB_00107d15:
                local_24.list = true;
                local_144 = 4;
              }
              else {
                bVar1 = std::operator==((char *)in_stack_fffffffffffffc80,
                                        &in_stack_fffffffffffffc78->first);
                if (bVar1) goto LAB_00107d15;
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffc80,
                                        (char *)in_stack_fffffffffffffc78);
                if (bVar1) {
LAB_00107d75:
                  local_24.time = true;
                  local_144 = 4;
                }
                else {
                  bVar1 = std::operator==((char *)in_stack_fffffffffffffc80,
                                          &in_stack_fffffffffffffc78->first);
                  if (bVar1) goto LAB_00107d75;
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffffc80,
                                          (char *)in_stack_fffffffffffffc78);
                  if (bVar1) {
LAB_00107dd5:
                    local_24.pass = true;
                    local_144 = 4;
                  }
                  else {
                    bVar1 = std::operator==((char *)in_stack_fffffffffffffc80,
                                            &in_stack_fffffffffffffc78->first);
                    if (bVar1) goto LAB_00107dd5;
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffffc80,
                                            (char *)in_stack_fffffffffffffc78);
                    if (bVar1) {
LAB_00107e35:
                      local_24.zen = true;
                      local_144 = 4;
                    }
                    else {
                      in_stack_fffffffffffffccf =
                           std::operator==((char *)in_stack_fffffffffffffc80,
                                           &in_stack_fffffffffffffc78->first);
                      if ((bool)in_stack_fffffffffffffccf) goto LAB_00107e35;
                      in_stack_fffffffffffffcce =
                           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffffc80,
                                           (char *)in_stack_fffffffffffffc78);
                      if ((bool)in_stack_fffffffffffffcce) {
LAB_00107e95:
                        local_24.verbose = true;
                        local_144 = 4;
                      }
                      else {
                        in_stack_fffffffffffffccd =
                             std::operator==((char *)in_stack_fffffffffffffc80,
                                             &in_stack_fffffffffffffc78->first);
                        if ((bool)in_stack_fffffffffffffccd) goto LAB_00107e95;
                        in_stack_fffffffffffffccc =
                             std::operator==((char *)in_stack_fffffffffffffc80,
                                             &in_stack_fffffffffffffc78->first);
                        if ((bool)in_stack_fffffffffffffccc) {
                          local_24.version = true;
                          local_144 = 4;
                        }
                        else {
                          in_stack_fffffffffffffccb =
                               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffffc80,
                                               (char *)in_stack_fffffffffffffc78);
                          if ((bool)in_stack_fffffffffffffccb) {
                            in_stack_fffffffffffffcca =
                                 std::operator==((char *)in_stack_fffffffffffffc80,
                                                 &in_stack_fffffffffffffc78->first);
                            if ((bool)in_stack_fffffffffffffcca) {
                              local_144 = 4;
                              goto LAB_0010847d;
                            }
                          }
                          in_stack_fffffffffffffcc9 =
                               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)in_stack_fffffffffffffc80,
                                               (char *)in_stack_fffffffffffffc78);
                          if ((bool)in_stack_fffffffffffffcc9) {
                            in_stack_fffffffffffffcc8 =
                                 std::operator==((char *)in_stack_fffffffffffffc80,
                                                 &in_stack_fffffffffffffc78->first);
                            if ((bool)in_stack_fffffffffffffcc8) {
                              local_24.lexical = true;
                              local_144 = 4;
                              goto LAB_0010847d;
                            }
                          }
                          uVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffc80,
                                                  (char *)in_stack_fffffffffffffc78);
                          if ((bool)uVar2) {
                            in_stack_fffffffffffffcc6 =
                                 std::operator==((char *)in_stack_fffffffffffffc80,
                                                 &in_stack_fffffffffffffc78->first);
                            if ((bool)in_stack_fffffffffffffcc6) {
                              local_24.random = true;
                              local_144 = 4;
                              goto LAB_0010847d;
                            }
                          }
                          uVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffc80,
                                                  (char *)in_stack_fffffffffffffc78);
                          if ((bool)uVar3) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_188,"--random-seed",&local_189);
                            std::__cxx11::string::string(local_168,local_188);
                            std::__cxx11::string::string(local_1b0,local_b0);
                            local_24.seed =
                                 seed(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
                            std::__cxx11::string::~string(local_1b0);
                            std::__cxx11::string::~string(local_168);
                            std::__cxx11::string::~string(local_188);
                            std::allocator<char>::~allocator((allocator<char> *)&local_189);
                            local_144 = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffffc80,
                                                  (char *)in_stack_fffffffffffffc78);
                            if (!bVar1) {
                              this = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::operator+((char *)in_stack_fffffffffffffce8,
                                             in_stack_fffffffffffffce0);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT17(in_stack_fffffffffffffccf,
                                                         CONCAT16(in_stack_fffffffffffffcce,
                                                                  CONCAT15(in_stack_fffffffffffffccd
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffccc,
                                                  CONCAT13(in_stack_fffffffffffffccb,
                                                           CONCAT12(in_stack_fffffffffffffcca,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffcc9,
                                                  in_stack_fffffffffffffcc8))))))),
                                             (char *)CONCAT17(uVar2,CONCAT16(
                                                  in_stack_fffffffffffffcc6,
                                                  CONCAT15(uVar3,in_stack_fffffffffffffcc0))));
                              std::runtime_error::runtime_error(local_228,local_248);
                              std::runtime_error::runtime_error(this,local_228);
                              __cxa_throw(this,&std::runtime_error::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_1f0,"--repeat",&local_1f1);
                            std::__cxx11::string::string(local_1d0,local_1f0);
                            std::__cxx11::string::string(local_218,local_b0);
                            in_stack_fffffffffffffca4 =
                                 repeat(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
                            local_24.repeat = in_stack_fffffffffffffca4;
                            std::__cxx11::string::~string(local_218);
                            std::__cxx11::string::~string(local_1d0);
                            std::__cxx11::string::~string(local_1f0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
                            local_144 = 4;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010847d:
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}